

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

BorderAmounts_EdgeSizes *
google::protobuf::internal::GenericTypeHandler<CoreML::Specification::BorderAmounts_EdgeSizes>::New
          (Arena *arena)

{
  Arena *arena_local;
  BorderAmounts_EdgeSizes *local_28;
  BorderAmounts_EdgeSizes *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (BorderAmounts_EdgeSizes *)operator_new(0x28);
    CoreML::Specification::BorderAmounts_EdgeSizes::BorderAmounts_EdgeSizes(local_28);
  }
  else {
    local_28 = (BorderAmounts_EdgeSizes *)
               Arena::AllocateAligned
                         (arena,(type_info *)
                                &CoreML::Specification::BorderAmounts_EdgeSizes::typeinfo,0x28);
    CoreML::Specification::BorderAmounts_EdgeSizes::BorderAmounts_EdgeSizes(local_28);
    Arena::AddListNode(arena,local_28,
                       arena_destruct_object<CoreML::Specification::BorderAmounts_EdgeSizes>);
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }